

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O2

bool __thiscall ON_Brep::RemoveSlits(ON_Brep *this)

{
  ON_BrepFace *pOVar1;
  bool bVar2;
  ulong uVar3;
  bool bVar4;
  long lVar5;
  
  lVar5 = 0;
  bVar4 = false;
  for (uVar3 = 0;
      (long)uVar3 <
      (long)(this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count;
      uVar3 = uVar3 + 1) {
    pOVar1 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
    if (uVar3 == *(uint *)((pOVar1->m_face_uuid).Data4 + lVar5 + -0x30)) {
      bVar2 = RemoveSlits(this,(ON_BrepFace *)((pOVar1->m_face_uuid).Data4 + lVar5 + -0x5c));
      bVar4 = (bool)(bVar4 | bVar2);
    }
    lVar5 = lVar5 + 0xd8;
  }
  return bVar4;
}

Assistant:

bool ON_Brep::RemoveSlits()

{
  bool rc = false;
  int i;
  for (i=0; i<m_F.Count(); i++){
    ON_BrepFace& F = m_F[i];
    if (F.m_face_index != i) continue;
    if (RemoveSlits(F))
      rc = true;
  }
  return rc;
}